

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void tinygltf::SerializeGltfImage(Image *image,string *uri,json *o)

{
  ulong uVar1;
  long lVar2;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  json *local_20;
  json *o_local;
  string *uri_local;
  Image *image_local;
  
  local_20 = o;
  o_local = (json *)uri;
  uri_local = &image->name;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"uri",&local_a1);
    SerializeStringProperty((string *)local_a0,(string *)o_local,local_20);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"mimeType",&local_41);
    SerializeStringProperty((string *)local_40,uri_local + 0x58,local_20);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"bufferView",&local_79);
    SerializeNumberProperty<int>((string *)local_78,*(int *)(uri_local + 0x50),local_20);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"name",&local_c9);
    SerializeStringProperty((string *)local_c8,uri_local,local_20);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  SerializeExtrasAndExtensions<tinygltf::Image>((Image *)uri_local,local_20);
  return;
}

Assistant:

static void SerializeGltfImage(const Image &image, const std::string &uri,
                               detail::json &o) {
  // From 2.7.0, we look for `uri` parameter, not `Image.uri`
  // if uri is empty, the mimeType and bufferview should be set
  if (uri.empty()) {
    SerializeStringProperty("mimeType", image.mimeType, o);
    SerializeNumberProperty<int>("bufferView", image.bufferView, o);
  } else {
    SerializeStringProperty("uri", uri, o);
  }

  if (image.name.size()) {
    SerializeStringProperty("name", image.name, o);
  }

  SerializeExtrasAndExtensions(image, o);
}